

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

mpack_node_t mpack_node_map_value_at(mpack_node_t node,size_t index)

{
  mpack_node_t mVar1;
  size_t index_local;
  mpack_node_t node_local;
  
  mVar1 = mpack_node_map_at(node,index,1);
  return mVar1;
}

Assistant:

MPACK_INLINE mpack_node_t mpack_node_map_value_at(mpack_node_t node, size_t index) {
    return mpack_node_map_at(node, index, 1);
}